

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

string * ToLower_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  char cVar1;
  long lVar2;
  char __c;
  size_type __res;
  size_type sVar3;
  long in_FS_OFFSET;
  
  __res = str._M_len;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  if (__res != 0) {
    sVar3 = 0;
    do {
      cVar1 = str._M_str[sVar3];
      __c = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        __c = cVar1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
      sVar3 = sVar3 + 1;
    } while (__res != sVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToLower(std::string_view str)
{
    std::string r;
    r.reserve(str.size());
    for (auto ch : str) r += ToLower(ch);
    return r;
}